

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

drmp3_uint64
drmp3_src_read_frames_ex
          (drmp3_src *pSRC,drmp3_uint64 frameCount,void *pFramesOut,drmp3_bool32 flush)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  drmp3_src_algorithm dVar5;
  drmp3_uint64 dVar6;
  ulong uVar7;
  drmp3_uint64 dVar8;
  ulong uVar9;
  float *pFramesOut_00;
  int iVar10;
  int iVar11;
  double dVar12;
  
  if (pFramesOut == (void *)0x0 || (frameCount == 0 || pSRC == (drmp3_src *)0x0)) {
    return 0;
  }
  dVar5 = drmp3_src_algorithm_none;
  if ((pSRC->config).sampleRateIn != (pSRC->config).sampleRateOut) {
    dVar5 = (pSRC->config).algorithm;
  }
  if (dVar5 != drmp3_src_algorithm_linear) {
    if (dVar5 == drmp3_src_algorithm_none) {
      dVar6 = (*pSRC->onRead)(pSRC,frameCount,pFramesOut,pSRC->pUserData);
      return dVar6;
    }
    return 0;
  }
  bVar4 = *(byte *)((long)&pSRC->algo + 8);
  if ((bVar4 & 1) == 0) {
    dVar6 = drmp3_src_cache_read_frames(&pSRC->cache,1,pSRC->bin);
    if (dVar6 == 0) {
      return 0;
    }
    bVar4 = *(byte *)((long)&pSRC->algo + 8) | 1;
    *(byte *)((long)&pSRC->algo + 8) = bVar4;
  }
  if ((bVar4 & 2) == 0) {
    dVar6 = drmp3_src_cache_read_frames(&pSRC->cache,1,pSRC->bin + (pSRC->config).channels);
    if (dVar6 == 0) {
      return 0;
    }
    pbVar1 = (byte *)((long)&pSRC->algo + 8);
    *pbVar1 = *pbVar1 | 2;
  }
  if (frameCount == 0) {
    return 0;
  }
  uVar2 = (pSRC->config).sampleRateIn;
  uVar3 = (pSRC->config).sampleRateOut;
  uVar7 = (ulong)(pSRC->config).channels;
  dVar6 = 0;
  do {
    pFramesOut_00 = pSRC->bin + uVar7;
    dVar12 = (pSRC->algo).linear.alpha;
    if ((int)uVar7 != 0) {
      uVar9 = 0;
      do {
        *(float *)((long)pFramesOut + uVar9 * 4) =
             pSRC->bin[uVar9] * (1.0 - (float)dVar12) + pFramesOut_00[uVar9] * (float)dVar12;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      dVar12 = (pSRC->algo).linear.alpha;
    }
    dVar12 = dVar12 + (double)uVar2 / (double)uVar3;
    uVar9 = (ulong)dVar12;
    iVar11 = (int)uVar9;
    (pSRC->algo).linear.alpha = dVar12 - (double)(uVar9 & 0xffffffff);
    if (iVar11 != 0) {
      iVar10 = 0;
      do {
        uVar7 = (ulong)(pSRC->config).channels;
        if (uVar7 != 0) {
          uVar9 = 0;
          do {
            pSRC->bin[uVar9] = pFramesOut_00[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        dVar8 = drmp3_src_cache_read_frames(&pSRC->cache,1,pFramesOut_00);
        if (dVar8 == 0) {
          uVar7 = (ulong)(pSRC->config).channels;
          if (uVar7 != 0) {
            memset(pFramesOut_00,0,uVar7 * 4);
          }
          bVar4 = *(byte *)((long)&pSRC->algo + 8);
          if ((bVar4 & 2) == 0) {
            if (flush != 0) {
              *(byte *)((long)&pSRC->algo + 8) = bVar4 & 0xfc;
            }
          }
          else {
            *(byte *)((long)&pSRC->algo + 8) = bVar4 & 0xfd;
          }
          goto LAB_00107bd9;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar11);
      uVar7 = (ulong)(pSRC->config).channels;
    }
LAB_00107bd9:
    pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
    frameCount = frameCount - 1;
    dVar6 = dVar6 + 1;
    if ((undefined1  [16])((undefined1  [16])pSRC->algo & (undefined1  [16])0x2) ==
        (undefined1  [16])0x0) {
      if (flush == 0) {
        return dVar6;
      }
      if ((undefined1  [16])((undefined1  [16])pSRC->algo & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        return dVar6;
      }
    }
    if (frameCount == 0) {
      return dVar6;
    }
  } while( true );
}

Assistant:

drmp3_uint64 drmp3_src_read_frames_ex(drmp3_src* pSRC, drmp3_uint64 frameCount, void* pFramesOut, drmp3_bool32 flush)
{
    if (pSRC == NULL || frameCount == 0 || pFramesOut == NULL) return 0;

    drmp3_src_algorithm algorithm = pSRC->config.algorithm;

    // Always use passthrough if the sample rates are the same.
    if (pSRC->config.sampleRateIn == pSRC->config.sampleRateOut) {
        algorithm = drmp3_src_algorithm_none;
    }

    // Could just use a function pointer instead of a switch for this...
    switch (algorithm)
    {
        case drmp3_src_algorithm_none:   return drmp3_src_read_frames_passthrough(pSRC, frameCount, pFramesOut, flush);
        case drmp3_src_algorithm_linear: return drmp3_src_read_frames_linear(pSRC, frameCount, pFramesOut, flush);
        default: return 0;
    }
}